

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

void llvm::sys::path::native(SmallVectorImpl<char> *Path,Style style)

{
  reference pcVar1;
  char *__first;
  ulong uVar3;
  char *__last;
  char local_12;
  char local_11;
  char *pcVar2;
  
  uVar3 = (ulong)(Path->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  if (uVar3 != 0) {
    __first = (char *)(Path->super_SmallVectorTemplateBase<char,_true>).
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    __last = __first + uVar3;
    if (style == windows) {
      std::replace<char*,char>(__first,__last,&local_12,&local_11);
      pcVar1 = SmallVectorTemplateCommon<char,_void>::operator[]
                         ((SmallVectorTemplateCommon<char,_void> *)Path,0);
      if (*pcVar1 == '~') {
        if ((Path->super_SmallVectorTemplateBase<char,_true>).
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size != 1) {
          pcVar1 = SmallVectorTemplateCommon<char,_void>::operator[]
                             ((SmallVectorTemplateCommon<char,_void> *)Path,1);
          if ((*pcVar1 != '\\') && (*pcVar1 != '/')) {
            return;
          }
        }
        llvm_unreachable_internal
                  ("BINARYEN native",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/Path.cpp"
                   ,0x1ed);
      }
    }
    else {
      while (__first < __last) {
        pcVar2 = __first;
        if ((*__first == '\\') && ((pcVar2 = __first + 1, __last <= pcVar2 || (*pcVar2 != '\\')))) {
          *__first = '/';
          pcVar2 = __first;
        }
        __first = pcVar2 + 1;
      }
    }
  }
  return;
}

Assistant:

void native(SmallVectorImpl<char> &Path, Style style) {
  if (Path.empty())
    return;
  if (real_style(style) == Style::windows) {
    std::replace(Path.begin(), Path.end(), '/', '\\');
    if (Path[0] == '~' && (Path.size() == 1 || is_separator(Path[1], style))) {
      llvm_unreachable("BINARYEN native");
#if 0
      SmallString<128> PathHome;
      home_directory(PathHome);
      PathHome.append(Path.begin() + 1, Path.end());
      Path = PathHome;
#endif
    }
  } else {
    for (auto PI = Path.begin(), PE = Path.end(); PI < PE; ++PI) {
      if (*PI == '\\') {
        auto PN = PI + 1;
        if (PN < PE && *PN == '\\')
          ++PI; // increment once, the for loop will move over the escaped slash
        else
          *PI = '/';
      }
    }
  }
}